

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Transpose<Eigen::ArrayWrapper<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>>const>const>const>,Eigen::internal::add_assign_op<double,double>>
               (Transpose<Eigen::ArrayWrapper<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
                *dst,CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
                     *src,add_assign_op<double,_double> *func)

{
  variable_if_dynamic<long,__1> func_00;
  Transpose<Eigen::ArrayWrapper<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
  *dstExpr;
  undefined1 local_a8 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_60 [8];
  SrcEvaluatorType srcEvaluator;
  add_assign_op<double,_double> *func_local;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
  *src_local;
  Transpose<Eigen::ArrayWrapper<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
  *dst_local;
  
  srcEvaluator.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.rhsImpl.
  super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
  .
  super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>,_Eigen::internal::IndexBased,_double>
  .m_d.argImpl.
  super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
  .
  super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::IndexBased,_float>
  .m_d.argImpl.
  super_evaluator<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  .
  super_unary_evaluator<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
  .
  super_evaluator_wrapper_base<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  .m_argImpl.
  super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>
  .m_outerStride.m_value = (long)func;
  evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
  ::evaluator((evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
               *)local_60,src);
  resize_if_allowed<Eigen::Transpose<Eigen::ArrayWrapper<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>>const>const>const>,Eigen::internal::add_assign_op<double,double>>
            (dst,src,(add_assign_op<double,_double> *)
                     srcEvaluator.
                     super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                     .m_d.rhsImpl.
                     super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
                     .
                     super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>,_Eigen::internal::IndexBased,_double>
                     .m_d.argImpl.
                     super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
                     .
                     super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::IndexBased,_float>
                     .m_d.argImpl.
                     super_evaluator<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                     .
                     super_unary_evaluator<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
                     .
                     super_evaluator_wrapper_base<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                     .m_argImpl.
                     super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>
                     .m_outerStride.m_value);
  evaluator<Eigen::Transpose<Eigen::ArrayWrapper<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>_>_>
  ::evaluator((evaluator<Eigen::Transpose<Eigen::ArrayWrapper<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>_>
               *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_d.rhsImpl.
            super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
            .
            super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>,_Eigen::internal::IndexBased,_double>
            .m_d.argImpl.
            super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
            .
            super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::IndexBased,_float>
            .m_d.argImpl.
            super_evaluator<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
            .
            super_unary_evaluator<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
            .
            super_evaluator_wrapper_base<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
            .m_argImpl.
            super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>
            .m_outerStride;
  dstExpr = EigenBase<Eigen::Transpose<Eigen::ArrayWrapper<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>_>_>
            ::const_cast_derived
                      ((EigenBase<Eigen::Transpose<Eigen::ArrayWrapper<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>_>
                        *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Transpose<Eigen::ArrayWrapper<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Transpose<Eigen::ArrayWrapper<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
              *)local_a8,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_60,
             (add_assign_op<double,_double> *)func_00.m_value,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Transpose<Eigen::ArrayWrapper<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_1,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Transpose<Eigen::ArrayWrapper<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
         *)local_a8);
  evaluator<Eigen::Transpose<Eigen::ArrayWrapper<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>_>_>
  ::~evaluator((evaluator<Eigen::Transpose<Eigen::ArrayWrapper<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>_>
                *)&kernel.m_dstExpr);
  evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
  ::~evaluator((evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<float,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
                *)local_60);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}